

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_bench.c
# Opt level: O0

bool_t ecpBench(void)

{
  undefined1 auVar1 [16];
  err_t eVar2;
  u32 seed;
  uint uVar3;
  size_t sVar4;
  undefined1 *ticks_00;
  undefined1 *stack_00;
  tm_ticks_t tVar5;
  tm_ticks_t tVar6;
  tm_ticks_t ticks;
  size_t i;
  size_t reps;
  void *stack;
  word *d;
  word *pt;
  octet *combo_state;
  ec_o *ec;
  octet state [6000];
  bign_params params [1];
  bign_params *in_stack_ffffffffffffe6d8;
  undefined4 in_stack_ffffffffffffe6e0;
  undefined4 in_stack_ffffffffffffe6e4;
  undefined1 *state_00;
  ulong local_1900;
  bign_params *in_stack_ffffffffffffe710;
  void *in_stack_ffffffffffffe718;
  bign_deep_i in_stack_ffffffffffffe728;
  undefined1 *m;
  size_t in_stack_ffffffffffffe730;
  word *d_00;
  ec_o *in_stack_ffffffffffffe738;
  word *in_stack_ffffffffffffe740;
  word *in_stack_ffffffffffffe748;
  
  sVar4 = bignStart_keep(in_stack_ffffffffffffe730,in_stack_ffffffffffffe728);
  if (((sVar4 < 0x1771) &&
      (eVar2 = bignParamsStd(in_stack_ffffffffffffe6d8,(char *)0x11b5b9), eVar2 == 0)) &&
     (eVar2 = bignStart(in_stack_ffffffffffffe718,in_stack_ffffffffffffe710), eVar2 == 0)) {
    d_00 = (word *)&stack0xffffffffffffe738;
    ticks_00 = (undefined1 *)((long)d_00 + (long)in_stack_ffffffffffffe738);
    state_00 = ticks_00;
    sVar4 = prngCOMBO_keep();
    stack_00 = ticks_00 + sVar4;
    m = state_00;
    seed = utilNonce32();
    prngCOMBOStart(state_00,seed);
    local_1900 = 0;
    tVar5 = tmTicks();
    for (; local_1900 < 1000; local_1900 = local_1900 + 1) {
      prngCOMBOStepR(state_00,(size_t)ticks_00,
                     (void *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0));
      ecMulA(in_stack_ffffffffffffe748,in_stack_ffffffffffffe740,in_stack_ffffffffffffe738,d_00,
             (size_t)m,stack_00);
    }
    tVar6 = tmTicks();
    auVar1._8_8_ = 0;
    auVar1._0_8_ = tVar6 - tVar5;
    uVar3 = SUB164(auVar1 / ZEXT816(1000),0);
    sVar4 = tmSpeed((size_t)state_00,(tm_ticks_t)ticks_00);
    printf("ecpBench: %u cycles/mulpoint [%u mulpoints/sec]\n",(ulong)uVar3,sVar4 & 0xffffffff);
    return 1;
  }
  return 0;
}

Assistant:

bool_t ecpBench()
{
	// описание кривой
	bign_params params[1];
	// состояние
	octet state[6000];
	ec_o* ec;
	octet* combo_state;
	word* pt;
	word* d;
	void* stack;
	// подготовить память
	if (sizeof(state) < bignStart_keep(128, _ecpBench_deep))
		return FALSE;
	// загрузить параметры и создать описание кривой
	if (bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.1") != ERR_OK ||
		bignStart(state, params) != ERR_OK)
		return FALSE;
	// раскладка состояния
	ec = (ec_o*)state;
	ec->tpl = 0;
	combo_state = objEnd(ec, octet);
	pt = (word*)(combo_state + prngCOMBO_keep());
	d = pt + 2 * ec->f->n;
	stack = d + ec->f->n;
	// создать генератор COMBO
	prngCOMBOStart(combo_state, utilNonce32());
	// оценить число кратных точек в секунду
	{
		const size_t reps = 1000;
		size_t i;
		tm_ticks_t ticks;
		// эксперимент
		for (i = 0, ticks = tmTicks(); i < reps; ++i)
		{
			prngCOMBOStepR(d, ec->f->no, combo_state);
			ecMulA(pt, ec->base, ec, d, ec->f->n, stack);
		}
		ticks = tmTicks() - ticks;
		// печать результатов
		printf("ecpBench: %u cycles/mulpoint [%u mulpoints/sec]\n", 
			(unsigned)(ticks / reps),
			(unsigned)tmSpeed(reps, ticks));
	}
	// все нормально
	return TRUE;
}